

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmPackDn<(moira::Instr)157,(moira::Mode)4,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  Imu<4> im;
  StrWriter *this_00;
  Ea<(moira::Mode)4,_2> ry;
  Ea<(moira::Mode)4,_2> rx;
  Av<(moira::Instr)157,_(moira::Mode)4,_2> local_5c;
  u32 local_58;
  ushort local_54;
  u32 local_44;
  ushort local_40;
  
  im.raw = dasmIncRead<2>(this,addr);
  local_40 = op & 7;
  local_58 = *addr;
  local_54 = op >> 9 & 7;
  SVar1 = str->style->syntax;
  local_44 = local_58;
  this_00 = StrWriter::operator<<(str);
  StrWriter::operator<<(this_00,(Tab)(str->tab).raw);
  StrWriter::operator<<(this_00,(Ea<(moira::Mode)4,_2> *)&local_44);
  StrWriter::operator<<(this_00);
  StrWriter::operator<<(this_00,(Ea<(moira::Mode)4,_2> *)&local_58);
  StrWriter::operator<<(this_00);
  if ((SVar1 & ~MOIRA_MIT) == GNU) {
    StrWriter::operator<<(this_00,(Ims<2>)im.raw);
  }
  else {
    StrWriter::operator<<(this_00,im);
    local_5c.ext1 = 0;
    StrWriter::operator<<(str,&local_5c);
  }
  return;
}

Assistant:

void
Moira::dasmPackDn(StrWriter &str, u32 &addr, u16 op) const
{
    auto ext = dasmIncRead <Word> (addr);
    auto rx = Op <M,S> ( _____________xxx(op), addr );
    auto ry = Op <M,S> ( ____xxx_________(op), addr );

    switch (str.style.syntax) {

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            str << Ins<I>{} << str.tab << rx << Sep{} << ry << Sep{} << Ims<S>(ext);
            break;

        default:

            str << Ins<I>{} << str.tab << rx << Sep{} << ry << Sep{} << Imu(ext);
            str << Av<I, M, S>{};
    }
}